

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-arithm.cpp
# Opt level: O0

int main(void)

{
  Exception *ex;
  Exception *ex_1;
  undefined4 local_30;
  uint len_2;
  uint len_1;
  undefined4 local_20;
  uint len;
  uint inc;
  uint end;
  uint start;
  bool allowTrash;
  
  for (local_20 = 0; local_20 < 0x80; local_20 = local_20 + 1) {
    test_arithm<float>(local_20,2.0,1.0,false);
    test_abs<float>(local_20);
    test_arithm<double>(local_20,2.0,1.0,false);
    test_abs<double>(local_20);
  }
  for (local_30 = 0; local_30 < 0x80; local_30 = local_30 + 1) {
    test_arithm<int>(local_30,2,1,false);
    test_arithm<unsigned_int>(local_30,2,1,false);
    test_abs<int>(local_30);
    test_abs<unsigned_int>(local_30);
    test_arithm<long>(local_30,2,1,false);
    test_arithm<unsigned_long>(local_30,2,1,false);
    test_abs<long>(local_30);
    test_abs<unsigned_long>(local_30);
  }
  for (ex_1._4_4_ = 0; ex_1._4_4_ < 0x80; ex_1._4_4_ = ex_1._4_4_ + 1) {
    test_arithm<unsigned_char>(ex_1._4_4_,'\x02','\x01',false);
    test_arithm<short>(ex_1._4_4_,2,1,false);
    test_arithm<unsigned_short>(ex_1._4_4_,2,1,false);
    test_abs<short>(ex_1._4_4_);
    test_abs<signed_char>(ex_1._4_4_);
  }
  return 0;
}

Assistant:

int main()
{
    try
    {
#ifdef ALLOW_TRASH
        bool allowTrash = true;
#else
        bool allowTrash = false;
#endif
#ifdef MORE_DATA
        unsigned start = 1000;
        unsigned end = 1024 * 1024;
        unsigned inc = 100000;
#else
        unsigned start = 0;
        unsigned end = 128;
        unsigned inc = 1;
#endif
        for (unsigned len = start; len < end; len+=inc)
        {
            test_arithm<float>(len, 2, 1, allowTrash);
            test_abs<float>(len);

            test_arithm<double>(len, 2, 1, allowTrash);
            test_abs<double>(len);
        }

        for (unsigned len = start; len < end; len+=inc)
        {
            test_arithm<int32_t>(len, 2, 1, allowTrash);
            test_arithm<uint32_t>(len, 2, 1, allowTrash);
            test_abs<int32_t>(len);
            test_abs<uint32_t>(len);

            test_arithm<int64_t>(len, 2, 1, allowTrash);
            test_arithm<uint64_t>(len, 2, 1, allowTrash);
            test_abs<int64_t>(len);
            test_abs<uint64_t>(len);
        }

#ifndef NO_8_16
        for (unsigned len = start; len < end; len+=inc)
        {
            test_arithm<uint8_t>(len, 2, 1, allowTrash);
            test_arithm<int16_t>(len, 2, 1, allowTrash);
            test_arithm<uint16_t>(len, 2, 1, allowTrash);
            test_abs<int16_t>(len);
            test_abs<int8_t>(len);
        }
#endif
    }
    catch (const simd::Exception& ex) {
        std::cerr << ex.file() << ":" << ex.line() << " (" << ex.code() << ") " << ex.what() << std::endl;
        return 1;
    }
    catch (const Exception& ex)
    {
        std::cerr << "func: " << ex.func_ << " line: " << ex.line_ << " len: " << ex.length_ << std::endl;
        return 1;
    }

    return 0;
}